

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int libssh2_userauth_publickey
              (LIBSSH2_SESSION *session,char *user,uchar *pubkeydata,size_t pubkeydata_len,
              _func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr
              *sign_callback,void **abstract)

{
  int iVar1;
  time_t start_time;
  size_t sVar2;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    iVar1 = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      sVar2 = strlen(user);
      iVar1 = _libssh2_userauth_publickey
                        (session,user,(uint)sVar2,pubkeydata,pubkeydata_len,sign_callback,abstract);
      if (iVar1 != -0x25) {
        return iVar1;
      }
      if (session->api_block_mode == 0) {
        return -0x25;
      }
      iVar1 = _libssh2_wait_socket(session,start_time);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey(LIBSSH2_SESSION *session,
                           const char *user,
                           const unsigned char *pubkeydata,
                           size_t pubkeydata_len,
                           LIBSSH2_USERAUTH_PUBLICKEY_SIGN_FUNC((*sign_callback)),
                           void **abstract)
{
    int rc;

    if(!session)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, session,
                 _libssh2_userauth_publickey(session, user, strlen(user),
                                             pubkeydata, pubkeydata_len,
                                             sign_callback, abstract));
    return rc;
}